

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::MatchExpr::toString_abi_cxx11_(string *__return_storage_ptr__,MatchExpr *this)

{
  __tuple_element_t<0UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  pTVar1;
  Token *pTVar2;
  bool bVar3;
  bool bVar4;
  Expr *pEVar5;
  __tuple_element_t<0UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *ppTVar6;
  Lexer *pLVar7;
  __tuple_element_t<1UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *p_Var8;
  __tuple_element_t<2UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *this_00;
  pointer pBVar9;
  string local_108;
  string local_e8;
  string local_c8 [32];
  reference local_a8;
  Token **var;
  const_iterator __end3;
  const_iterator __begin3;
  __tuple_element_t<1UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *__range3;
  string local_80 [7];
  bool first;
  reference local_60;
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *matchcase;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *__range1;
  allocator<char> local_1a;
  undefined1 local_19;
  MatchExpr *local_18;
  MatchExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (MatchExpr *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"match ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  pEVar5 = getExpression(this);
  (*pEVar5->_vptr_Expr[2])();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  __end1 = std::
           vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ::begin(&this->cases);
  matchcase = (tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               *)std::
                 vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                 ::end(&this->cases);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
                                     *)&matchcase), bVar3) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
               ::operator*(&__end1);
    ppTVar6 = std::
              get<0ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        (local_60);
    pTVar1 = *ppTVar6;
    pLVar7 = Expr::getLexer(&this->super_Expr);
    (*pTVar1->_vptr_Token[2])(local_80,pTVar1,pLVar7);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
    p_Var8 = std::
             get<1ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                       (local_60);
    bVar3 = std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::empty
                      (p_Var8);
    if (!bVar3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
      bVar3 = true;
      p_Var8 = std::
               get<1ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                         (local_60);
      __end3 = std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::begin
                         (p_Var8);
      var = (Token **)
            std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::end
                      (p_Var8);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_pfederc::Token_*const_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>_>
                                         *)&var), bVar4) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<const_pfederc::Token_*const_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>_>
                   ::operator*(&__end3);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        pTVar2 = *local_a8;
        pLVar7 = Expr::getLexer(&this->super_Expr);
        (*pTVar2->_vptr_Token[2])(local_c8,pTVar2,pLVar7);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_c8);
        std::__cxx11::string::~string(local_c8);
        __gnu_cxx::
        __normal_iterator<const_pfederc::Token_*const_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," => ");
    this_00 = std::
              get<2ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        (local_60);
    pBVar9 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                       (this_00);
    BodyExpr::toString_abi_cxx11_(&local_e8,pBVar9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __gnu_cxx::
    __normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->anyCase);
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_ => ");
    pBVar9 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                       (&this->anyCase);
    BodyExpr::toString_abi_cxx11_(&local_108,pBVar9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string MatchExpr::toString() const noexcept {
  std::string result = "match ";
  result += getExpression().toString();
  result += '\n';
  for (auto &matchcase : cases) {
    result += std::get<0>(matchcase)->toString(getLexer());
    if (!std::get<1>(matchcase).empty()) {
      result += '(';
      bool first = true;
      for (auto &var : std::get<1>(matchcase)) {
        if (!first)
          result += ", ";
        else
          first = false;

        result += var->toString(getLexer());
      }
      result += ')';
    }

    result += " => ";

    result += std::get<2>(matchcase)->toString();
    result += ";\n";
  }

  if (anyCase) {
    result += "_ => ";
    result += anyCase->toString();
    result += ";\n";
  }

  result += ';';

  return result;
}